

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

void __thiscall VCPostBuildEventTool::VCPostBuildEventTool(VCPostBuildEventTool *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_30,"PostBuildEvent");
  VCEventTool::VCEventTool(&this->super_VCEventTool,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  (this->super_VCEventTool).super_VCToolBase._vptr_VCToolBase =
       (_func_int **)&PTR__VCEventTool_002688f8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VCPostBuildEventTool::VCPostBuildEventTool()
    : VCEventTool("PostBuildEvent")
{
}